

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicUnsizedArrayCase::BlockBasicUnsizedArrayCase
          (BlockBasicUnsizedArrayCase *this,Context *context,char *name,char *description,
          VarType *elementType,int arraySize,deUint32 layoutFlags)

{
  BufferBlock *pBVar1;
  VarType local_80;
  BufferVar local_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,context->m_testCtx,context->m_renderCtx,name,
             SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00b4ab78;
  pBVar1 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  glu::VarType::VarType(&local_80,(VarType *)description,-1);
  bb::BufferVar::BufferVar(&local_68,"var",&local_80,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (&pBVar1->m_variables,&local_68);
  glu::VarType::~VarType(&local_68.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
    operator_delete(local_68.m_name._M_dataplus._M_p,
                    local_68.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  pBVar1->m_flags = arraySize;
  *(pBVar1->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = (int)elementType;
  return;
}

Assistant:

BlockBasicUnsizedArrayCase (Context& context, const char* name, const char* description, const VarType& elementType, int arraySize, deUint32 layoutFlags)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", VarType(elementType, VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		block.setLastUnsizedArraySize(0, arraySize);
	}